

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeList.c
# Opt level: O0

int FreeListInit(FreeList *free_list,size_t elementSize,int maxFreeListLength)

{
  int maxFreeListLength_local;
  size_t elementSize_local;
  FreeList *free_list_local;
  
  if (free_list != (FreeList *)0x0) {
    if (free_list == (FreeList *)0x0) {
      free_list_local._4_4_ = 0x16;
    }
    else {
      free_list->element_size = elementSize;
      free_list->maxFreeListLength = maxFreeListLength;
      free_list->head = (FreeListNode *)0x0;
      free_list->freeListLength = 0;
      free_list_local._4_4_ = 0;
    }
    return free_list_local._4_4_;
  }
  __assert_fail("free_list != NULL",".upnp/src/threadutil/FreeList.c",0x28,
                "int FreeListInit(FreeList *, size_t, int)");
}

Assistant:

int FreeListInit(FreeList *free_list, size_t elementSize, int maxFreeListLength)
{
	assert(free_list != NULL);

	if (free_list == NULL)
		return EINVAL;
	free_list->element_size = elementSize;
	free_list->maxFreeListLength = maxFreeListLength;
	free_list->head = NULL;
	free_list->freeListLength = 0;

	return 0;
}